

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O0

void Diligent::ValidatePSOCreateInfo<Diligent::RayTracingPipelineStateCreateInfo>
               (IRenderDevice *pDevice,RayTracingPipelineStateCreateInfo *CreateInfo)

{
  Char *Message;
  char (*in_RCX) [19];
  undefined1 local_38 [8];
  string msg;
  RayTracingPipelineStateCreateInfo *CreateInfo_local;
  IRenderDevice *pDevice_local;
  
  msg.field_2._8_8_ = CreateInfo;
  if (pDevice == (IRenderDevice *)0x0) {
    FormatString<char[26],char[19]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x484fe8,
               in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"ValidatePSOCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x3bf);
    std::__cxx11::string::~string((string *)local_38);
  }
  anon_unknown_61::ValidateRayTracingPipelineCreateInfo
            (pDevice,(RayTracingPipelineStateCreateInfo *)msg.field_2._8_8_);
  return;
}

Assistant:

void ValidatePSOCreateInfo<RayTracingPipelineStateCreateInfo>(const IRenderDevice*                     pDevice,
                                                              const RayTracingPipelineStateCreateInfo& CreateInfo) noexcept(false)
{
    VERIFY_EXPR(pDevice != nullptr);
    ValidateRayTracingPipelineCreateInfo(pDevice, CreateInfo);
}